

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

IdList * sqlite3IdListAppend(sqlite3 *db,IdList *pList,Token *pToken)

{
  undefined8 in_RAX;
  IdList_item *pIVar1;
  char *pcVar2;
  int i;
  
  i = (int)((ulong)in_RAX >> 0x20);
  if ((pList != (IdList *)0x0) ||
     (pList = (IdList *)sqlite3DbMallocZero(db,0x10), pList != (IdList *)0x0)) {
    pIVar1 = (IdList_item *)sqlite3ArrayAllocate(db,pList->a,0x10,&pList->nId,&i);
    pList->a = pIVar1;
    if (-1 < (long)i) {
      pcVar2 = sqlite3NameFromToken(db,pToken);
      pList->a[i].zName = pcVar2;
      return pList;
    }
    sqlite3IdListDelete(db,pList);
  }
  return (IdList *)0x0;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(sqlite3 *db, IdList *pList, Token *pToken){
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }
  pList->a = sqlite3ArrayAllocate(
      db,
      pList->a,
      sizeof(pList->a[0]),
      &pList->nId,
      &i
  );
  if( i<0 ){
    sqlite3IdListDelete(db, pList);
    return 0;
  }
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  return pList;
}